

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O3

void __thiscall Fl_Table_Type::add_child(Fl_Table_Type *this,Fl_Type *cc,Fl_Type *before)

{
  Fl_Type *o;
  int index;
  Fl_Group *this_00;
  Fl_Type *o_00;
  
  if (before == (Fl_Type *)0x0) {
    o_00 = (Fl_Type *)0x0;
  }
  else {
    o_00 = before[1].prev;
  }
  this_00 = *(Fl_Group **)&(this->super_Fl_Group_Type).super_Fl_Widget_Type.o[3].w_;
  if (this_00->children_ == 3) {
    fl_message(
              "Inserting child widgets into an Fl_Table is not recommended.\nPlease refer to the documentation on Fl_Table."
              );
    this_00 = *(Fl_Group **)&(this->super_Fl_Group_Type).super_Fl_Widget_Type.o[3].w_;
  }
  o = cc[1].prev;
  index = Fl_Group::find(this_00,(Fl_Widget *)o_00);
  Fl_Group::insert(this_00,(Fl_Widget *)o,index);
  Fl_Widget::redraw((this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  return;
}

Assistant:

void Fl_Table_Type::add_child(Fl_Type* cc, Fl_Type* before) {
  Fl_Widget_Type* c = (Fl_Widget_Type*)cc;
  Fl_Widget* b = before ? ((Fl_Widget_Type*)before)->o : 0;
  if (((Fl_Table*)o)->children()==1) { // the FLuid_Table has one extra child
    fl_message("Inserting child widgets into an Fl_Table is not recommended.\n"
               "Please refer to the documentation on Fl_Table.");
  }
  ((Fl_Table*)o)->insert(*(c->o), b);
  o->redraw();
}